

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBvhTriangleMeshShape.cpp
# Opt level: O2

void __thiscall cbtBvhTriangleMeshShape::buildOptimizedBvh(cbtBvhTriangleMeshShape *this)

{
  cbtOptimizedBvh *this_00;
  
  if (this->m_ownsBvh == true) {
    (**(this->m_bvh->super_cbtQuantizedBvh)._vptr_cbtQuantizedBvh)();
    cbtAlignedFreeInternal(this->m_bvh);
  }
  this_00 = (cbtOptimizedBvh *)cbtAlignedAllocInternal(0xf8,0x10);
  cbtOptimizedBvh::cbtOptimizedBvh(this_00);
  this->m_bvh = this_00;
  cbtOptimizedBvh::build
            (this_00,(this->super_cbtTriangleMeshShape).m_meshInterface,
             this->m_useQuantizedAabbCompression,&(this->super_cbtTriangleMeshShape).m_localAabbMin,
             &(this->super_cbtTriangleMeshShape).m_localAabbMax);
  this->m_ownsBvh = true;
  return;
}

Assistant:

void cbtBvhTriangleMeshShape::buildOptimizedBvh()
{
	if (m_ownsBvh)
	{
		m_bvh->~cbtOptimizedBvh();
		cbtAlignedFree(m_bvh);
	}
	///m_localAabbMin/m_localAabbMax is already re-calculated in cbtTriangleMeshShape. We could just scale aabb, but this needs some more work
	void* mem = cbtAlignedAlloc(sizeof(cbtOptimizedBvh), 16);
	m_bvh = new (mem) cbtOptimizedBvh();
	//rebuild the bvh...
	m_bvh->build(m_meshInterface, m_useQuantizedAabbCompression, m_localAabbMin, m_localAabbMax);
	m_ownsBvh = true;
}